

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,Symbol *b)

{
  int iVar1;
  size_t __n;
  size_type __rlen;
  bool bVar2;
  string_view sVar3;
  string_view sVar4;
  
  sVar3 = Symbol::full_name((Symbol *)this);
  __n = sVar3._M_len;
  sVar4 = Symbol::full_name(a);
  if (__n == sVar4._M_len) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(sVar3._M_str,sVar4._M_str,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }